

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

int event_config_avoid_method(event_config *cfg,char *method)

{
  event_config_entry *__ptr;
  char *pcVar1;
  int iVar2;
  
  if (mm_malloc_fn_ == (_func_void_ptr_size_t *)0x0) {
    __ptr = (event_config_entry *)malloc(0x18);
  }
  else {
    __ptr = (event_config_entry *)(*mm_malloc_fn_)(0x18);
  }
  iVar2 = -1;
  if (__ptr != (event_config_entry *)0x0) {
    pcVar1 = event_mm_strdup_(method);
    __ptr->avoid_method = pcVar1;
    if (pcVar1 == (char *)0x0) {
      if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
        free(__ptr);
      }
      else {
        (*mm_free_fn_)(__ptr);
      }
    }
    else {
      (__ptr->next).tqe_next = (event_config_entry *)0x0;
      (__ptr->next).tqe_prev = (cfg->entries).tqh_last;
      *(cfg->entries).tqh_last = __ptr;
      (cfg->entries).tqh_last = (event_config_entry **)__ptr;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
event_config_avoid_method(struct event_config *cfg, const char *method)
{
	struct event_config_entry *entry = mm_malloc(sizeof(*entry));
	if (entry == NULL)
		return (-1);

	if ((entry->avoid_method = mm_strdup(method)) == NULL) {
		mm_free(entry);
		return (-1);
	}

	TAILQ_INSERT_TAIL(&cfg->entries, entry, next);

	return (0);
}